

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmLib.c
# Opt level: O2

void Sfm_LibPrintObj(Sfm_Lib_t *p,Sfm_Fun_t *pObj)

{
  char *pcVar1;
  int *piVar2;
  char *pFanins2;
  Mio_Cell2_t *pCell2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  Mio_Cell2_t *pMVar6;
  ulong uVar7;
  Mio_Cell2_t *pMVar8;
  
  pMVar6 = p->pCells;
  pMVar8 = pMVar6 + pObj->pFansT[0];
  if ((long)pObj->pFansT[0] == 0) {
    iVar3 = 0;
  }
  else {
    iVar3 = (*(uint *)&pMVar8->field_0x10 >> 0x1c) - 1;
  }
  uVar4 = iVar3 + (*(uint *)&pMVar6[pObj->pFansB[0]].field_0x10 >> 0x1c);
  pMVar6 = pMVar6 + pObj->pFansB[0];
  printf("F = %d  A =%6.2f  ",(double)pObj->Area * 0.001,(ulong)uVar4);
  if (pMVar8 == p->pCells) {
    pcVar1 = pObj->pFansB;
    pCell2 = (Mio_Cell2_t *)0x0;
    pFanins2 = (char *)0x0;
  }
  else {
    pcVar1 = pObj->pFansT;
    pFanins2 = pObj->pFansB + 1;
    pCell2 = pMVar6;
    pMVar6 = pMVar8;
  }
  Sfm_LibPrintGate(pMVar6,pcVar1 + 1,pCell2,pFanins2);
  if (p->fDelay != 0) {
    iVar3 = Vec_IntEntry(&p->vProfs,(int)(((long)pObj - (long)p->pObjs) / 0x1c));
    piVar2 = Vec_IntEntryP(&p->vStore,iVar3);
    uVar7 = 0;
    uVar5 = (ulong)uVar4;
    if ((int)uVar4 < 1) {
      uVar5 = uVar7;
    }
    for (; uVar5 != uVar7; uVar7 = uVar7 + 1) {
      printf("%6.2f ",(double)piVar2[uVar7] * 0.001);
    }
  }
  return;
}

Assistant:

void Sfm_LibPrintObj( Sfm_Lib_t * p, Sfm_Fun_t * pObj )
{
    Mio_Cell2_t * pCellB = p->pCells + (int)pObj->pFansB[0];
    Mio_Cell2_t * pCellT = p->pCells + (int)pObj->pFansT[0];
    int i, nFanins = pCellB->nFanins + (pCellT == p->pCells ? 0 : pCellT->nFanins - 1);
    printf( "F = %d  A =%6.2f  ", nFanins, MIO_NUMINV*pObj->Area );
    if ( pCellT == p->pCells )
        Sfm_LibPrintGate( pCellB, pObj->pFansB + 1, NULL, NULL );
    else
        Sfm_LibPrintGate( pCellT, pObj->pFansT + 1, pCellB, pObj->pFansB + 1 );
    // get hold of delay info
    if ( p->fDelay )
    {
        int Offset  = Vec_IntEntry( &p->vProfs, Sfm_LibFunId(p, pObj) );
        int * pProf = Vec_IntEntryP( &p->vStore, Offset );
        for ( i = 0; i < nFanins; i++ )
            printf( "%6.2f ", MIO_NUMINV*pProf[i] );
    }
}